

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
* __thiscall
pbrt::
InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
::operator=(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
            *this,InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                  *other)

{
  bool bVar1;
  size_t sVar2;
  iterator ppPVar3;
  reference args;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  size_t i_1;
  int i;
  size_type in_stack_ffffffffffffffb8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffffc0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *this_00;
  polymorphic_allocator<pbrt::ParsedParameter_*> *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd8;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar6;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    clear(in_stack_ffffffffffffffc0);
    bVar1 = pstd::pmr::operator==(&in_RDI->alloc,in_stack_ffffffffffffffc8);
    if (bVar1) {
      pstd::swap<pbrt::ParsedParameter**>(&in_RDI->ptr,&in_RSI->ptr);
      pstd::swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      pstd::swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
      local_8 = in_RDI;
      if ((in_RDI->nStored != 0) && (in_RDI->ptr == (ParsedParameter **)0x0)) {
        for (iVar6 = 0; (ulong)(long)iVar6 < in_RDI->nStored; iVar6 = iVar6 + 1) {
          pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
          construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*>
                    ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,
                     (ParsedParameter **)((long)&in_RDI->field_2 + (long)iVar6 * 8),
                     (ParsedParameter **)((long)&in_RSI->field_2 + (long)iVar6 * 8));
        }
        in_RSI->nStored = in_RDI->nStored;
        local_8 = in_RDI;
      }
    }
    else {
      size(in_RSI);
      reserve((InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              in_stack_ffffffffffffffd8);
      uVar4 = 0;
      while (uVar5 = uVar4, sVar2 = size(in_RSI), uVar4 < sVar2) {
        ppPVar3 = begin(in_RDI);
        this_00 = (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)(ppPVar3 + uVar5);
        args = operator[](this_00,in_stack_ffffffffffffffb8);
        pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter*>::
        construct<pbrt::ParsedParameter*,pbrt::ParsedParameter*>
                  ((polymorphic_allocator<pbrt::ParsedParameter*> *)in_RDI,
                   (ParsedParameter **)this_00,args);
        uVar4 = uVar5 + 1;
      }
      sVar2 = size(in_RSI);
      in_RDI->nStored = sVar2;
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

InlinedVector &operator=(InlinedVector &&other) {
        if (this == &other)
            return *this;

        clear();
        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
            if (nStored > 0 && ptr == nullptr) {
                for (int i = 0; i < nStored; ++i)
                    alloc.template construct<T>(fixed + i, std::move(other.fixed[i]));
                other.nStored = nStored;  // so that dtors run...
            }
        } else {
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(begin() + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }